

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_ManPrintFuncs(Ses_Man_t *pSes)

{
  int local_14;
  int h;
  Ses_Man_t *pSes_local;
  
  printf("find optimum circuit for %d %d-variable functions:\n",(ulong)(uint)pSes->nSpecFunc,
         (ulong)(uint)pSes->nSpecVars);
  for (local_14 = 0; local_14 < pSes->nSpecFunc; local_14 = local_14 + 1) {
    printf("  func %d: ",(ulong)(local_14 + 1));
    Abc_TtPrintHexRev(_stdout,pSes->pSpec + (local_14 << 2),pSes->nSpecVars);
    printf("\n");
  }
  if ((pSes->nMaxDepth != -1) &&
     (printf("  max depth = %d\n",(ulong)(uint)pSes->nMaxDepth), pSes->pArrTimeProfile != (int *)0x0
     )) {
    printf("  arrival times =");
    for (local_14 = 0; local_14 < pSes->nSpecVars; local_14 = local_14 + 1) {
      printf(" %d",(ulong)(uint)pSes->pArrTimeProfile[local_14]);
    }
    printf("\n");
  }
  return;
}

Assistant:

static inline void Ses_ManPrintFuncs( Ses_Man_t * pSes )
{
    int h;

    printf( "find optimum circuit for %d %d-variable functions:\n", pSes->nSpecFunc, pSes->nSpecVars );
    for ( h = 0; h < pSes->nSpecFunc; ++h )
    {
        printf( "  func %d: ", h + 1 );
        Abc_TtPrintHexRev( stdout, &pSes->pSpec[h << 2], pSes->nSpecVars );
        printf( "\n" );
    }

    if ( pSes->nMaxDepth != -1 )
    {
        printf( "  max depth = %d\n", pSes->nMaxDepth );
        if ( pSes->pArrTimeProfile )
        {
            printf( "  arrival times =" );
            for ( h = 0; h < pSes->nSpecVars; ++h )
                printf( " %d", pSes->pArrTimeProfile[h] );
            printf( "\n" );
        }
    }
}